

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O3

void __thiscall AllReduceSockets::broadcast(AllReduceSockets *this,char *buffer,size_t n)

{
  int __fd;
  size_t sVar1;
  ssize_t sVar2;
  int *piVar3;
  char *__s;
  vw_exception *this_00;
  size_t sVar4;
  ulong parent_read_pos;
  bool bVar5;
  size_t children_sent_pos;
  stringstream __msg;
  size_t local_1e8;
  char *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  local_1e8 = 0;
  parent_read_pos = 0;
  if ((this->socks).parent == -1) {
    parent_read_pos = n;
  }
  if (((this->socks).children[0] == -1) && ((this->socks).children[1] == -1)) {
    local_1e8 = n;
  }
  bVar5 = parent_read_pos < n;
  local_1e0 = buffer;
  if (bVar5 || local_1e8 < n) {
    do {
      pass_down(this,buffer,parent_read_pos,&local_1e8);
      sVar1 = local_1e8;
      if (!(bool)(local_1e8 < n | bVar5)) {
        return;
      }
      __fd = (this->socks).parent;
      if (__fd != -1) {
        sVar4 = n - parent_read_pos;
        if (sVar4 == 0) {
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&local_1a8,"I think parent has no data to send but he thinks he has",0x37);
          this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this_00,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
                     ,0x11d,&local_1d8);
          __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        if (0xffff < sVar4) {
          sVar4 = 0x10000;
        }
        sVar2 = recv(__fd,buffer + parent_read_pos,sVar4,0);
        if ((int)sVar2 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr," recv from parent: ",0x13);
          piVar3 = __errno_location();
          __s = strerror(*piVar3);
          if (__s == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2d8a18);
          }
          else {
            sVar4 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar4);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
          std::ostream::put('\x18');
          std::ostream::flush();
        }
        parent_read_pos = parent_read_pos + (long)(int)sVar2;
        buffer = local_1e0;
      }
      bVar5 = parent_read_pos < n;
    } while (sVar1 < n || bVar5);
  }
  return;
}

Assistant:

void AllReduceSockets::broadcast(char* buffer, const size_t n)
{
  size_t parent_read_pos = 0;    // First unread float from parent
  size_t children_sent_pos = 0;  // First unsent float to children
  // parent_sent_pos <= left_read_pos
  // parent_sent_pos <= right_read_pos

  if (socks.parent == -1)
  {
    parent_read_pos = n;
  }
  if (socks.children[0] == -1 && socks.children[1] == -1)
    children_sent_pos = n;

  while (parent_read_pos < n || children_sent_pos < n)
  {
    pass_down(buffer, parent_read_pos, children_sent_pos);
    if (parent_read_pos >= n && children_sent_pos >= n)
      break;

    if (socks.parent != -1)
    {
      // there is data to be read from the parent
      if (parent_read_pos == n)
        THROW("I think parent has no data to send but he thinks he has");

      size_t count = min(ar_buf_size, n - parent_read_pos);
      int read_size = recv(socks.parent, buffer + parent_read_pos, (int)count, 0);
      if (read_size == -1)
      {
        cerr << " recv from parent: " << strerror(errno) << endl;
      }
      parent_read_pos += read_size;
    }
  }
}